

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ClassConfidenceThresholding::ByteSizeLong(ClassConfidenceThresholding *this)

{
  ulong uVar1;
  size_t sVar2;
  Rep *pRVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  
  lVar6 = (long)(this->precisionrecallcurves_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = lVar6 * 2;
  pRVar3 = (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    pRVar3 = (Rep *)pRVar3->elements;
  }
  for (lVar4 = 0; lVar6 * 8 != lVar4; lVar4 = lVar4 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::PrecisionRecallCurve>
                      (*(PrecisionRecallCurve **)((long)pRVar3->elements + lVar4 + -8));
    sVar5 = sVar5 + sVar2;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t ClassConfidenceThresholding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ClassConfidenceThresholding)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.PrecisionRecallCurve precisionRecallCurves = 100;
  total_size += 2UL * this->_internal_precisionrecallcurves_size();
  for (const auto& msg : this->precisionrecallcurves_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}